

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

bool operator<(period_sidx_map_key *lhs,period_sidx_map_key *rhs)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  iVar1 = rhs->sidx;
  iVar2 = lhs->sidx;
  bVar4 = SBORROW4(iVar2,iVar1);
  bVar3 = iVar2 - iVar1 < 0;
  if (iVar2 == iVar1) {
    iVar1 = rhs->period_no;
    iVar2 = lhs->period_no;
    bVar4 = SBORROW4(iVar2,iVar1);
    bVar3 = iVar2 - iVar1 < 0;
    if (iVar2 == iVar1) {
      bVar4 = SBORROW4(lhs->summary_id,rhs->summary_id);
      bVar3 = lhs->summary_id - rhs->summary_id < 0;
    }
  }
  return bVar4 != bVar3;
}

Assistant:

bool operator<(const period_sidx_map_key& lhs, const period_sidx_map_key& rhs)
{

	if (lhs.sidx != rhs.sidx) {
		return lhs.sidx < rhs.sidx;
	}
	else {
		if (lhs.period_no != rhs.period_no) {
			return lhs.period_no < rhs.period_no;
		}
		else {
			return lhs.summary_id < rhs.summary_id;
		}
	}

	
}